

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generators.cpp
# Opt level: O0

Matrix3d * opengv::generateRandomRotation(void)

{
  Scalar SVar1;
  int iVar2;
  Scalar *pSVar3;
  Scalar *pSVar4;
  double *scalar;
  Matrix3d *in_RDI;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *this;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *other;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
  *this_00;
  double dVar5;
  Matrix3d R3;
  Matrix3d R2;
  Matrix3d R1;
  Vector3d rpy;
  Matrix3d *rotation;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  *in_stack_fffffffffffffa48;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *this_01;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
  *in_stack_fffffffffffffb30;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
  *in_stack_fffffffffffffb38;
  
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0xb082cf);
  iVar2 = rand();
  this = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)((double)iVar2 / 2147483647.0);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa48);
  *pSVar3 = (Scalar)this;
  iVar2 = rand();
  other = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)((double)iVar2 / 2147483647.0);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa48);
  *pSVar3 = (Scalar)other;
  iVar2 = rand();
  this_00 = (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
             *)((double)iVar2 / 2147483647.0);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa48);
  *pSVar3 = (Scalar)this_00;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa48);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa48);
  *pSVar3 = (dVar5 - 0.5) * 6.283185307179586;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa48);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa48);
  *pSVar3 = (dVar5 - 0.5) * 3.141592653589793;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa48);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa48);
  *pSVar3 = (dVar5 - 0.5) * 6.283185307179586;
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0xb0846e);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb08482);
  *pSVar4 = 1.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb084a4);
  *pSVar4 = 0.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb084c2);
  *pSVar4 = 0.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb084e0);
  *pSVar4 = 0.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa48);
  dVar5 = cos(*pSVar3);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb0851d);
  *pSVar4 = dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa48);
  dVar5 = sin(*pSVar3);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb08575);
  *pSVar4 = -dVar5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb08595);
  *pSVar4 = 0.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb085b4);
  scalar = (double *)((ulong)*pSVar4 ^ 0x8000000000000000);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb085ec);
  *pSVar4 = (Scalar)scalar;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb0860b);
  this_01 = (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)*pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb0862a);
  *pSVar4 = (Scalar)this_01;
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0xb08641);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa48);
  dVar5 = cos(*pSVar3);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb08676);
  *pSVar4 = dVar5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb08696);
  *pSVar4 = 0.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa48);
  dVar5 = sin(*pSVar3);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb086d5);
  *pSVar4 = dVar5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb086f5);
  *pSVar4 = 0.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb08712);
  *pSVar4 = 1.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb08735);
  *pSVar4 = 0.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb08753);
  SVar1 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb0878a);
  *pSVar4 = -SVar1;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb087ab);
  *pSVar4 = 0.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb087c7);
  SVar1 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb087e6);
  *pSVar4 = SVar1;
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0xb087fd);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa48);
  dVar5 = cos(*pSVar3);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb08832);
  *pSVar4 = dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa48);
  dVar5 = sin(*pSVar3);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb0888d);
  *pSVar4 = -dVar5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb088b0);
  *pSVar4 = 0.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb088ce);
  SVar1 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb08908);
  *pSVar4 = -SVar1;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb08929);
  SVar1 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb0894b);
  *pSVar4 = SVar1;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb0896f);
  *pSVar4 = 0.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb0898d);
  *pSVar4 = 0.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb089ac);
  *pSVar4 = 0.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa48,0xb089c9);
  *pSVar4 = 1.0;
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this,
             (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffa48);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>::
  operator*(this_00,other);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)this,
             (EigenBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)in_stack_fffffffffffffa48);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::norm
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             in_stack_fffffffffffffa48);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>::operator/
            (this_01,scalar);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)this,
             in_stack_fffffffffffffa48);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>::
  cross<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
            (in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)this,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffa48);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::norm
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             in_stack_fffffffffffffa48);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>::operator/
            (this_01,scalar);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)this,
             in_stack_fffffffffffffa48);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>::
  cross<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
            (in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)this,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffa48);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::norm
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             in_stack_fffffffffffffa48);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>::operator/
            (this_01,scalar);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)this,
             in_stack_fffffffffffffa48);
  return in_RDI;
}

Assistant:

Eigen::Matrix3d
opengv::generateRandomRotation()
{
  Eigen::Vector3d rpy;
  rpy[0] = ((double) rand())/ ((double) RAND_MAX);
  rpy[1] = ((double) rand())/ ((double) RAND_MAX);
  rpy[2] = ((double) rand())/ ((double) RAND_MAX);

  rpy[0] = 2*M_PI*(rpy[0]-0.5);
  rpy[1] = M_PI*(rpy[1]-0.5);
  rpy[2] = 2*M_PI*(rpy[2]-0.5);

  Matrix3d R1;
  R1(0,0) = 1.0;
  R1(0,1) = 0.0;
  R1(0,2) = 0.0;
  R1(1,0) = 0.0;
  R1(1,1) = cos(rpy[0]);
  R1(1,2) = -sin(rpy[0]);
  R1(2,0) = 0.0;
  R1(2,1) = -R1(1,2);
  R1(2,2) = R1(1,1);

  Matrix3d R2;
  R2(0,0) = cos(rpy[1]);
  R2(0,1) = 0.0;
  R2(0,2) = sin(rpy[1]);
  R2(1,0) = 0.0;
  R2(1,1) = 1.0;
  R2(1,2) = 0.0;
  R2(2,0) = -R2(0,2);
  R2(2,1) = 0.0;
  R2(2,2) = R2(0,0);

  Matrix3d R3;
  R3(0,0) = cos(rpy[2]);
  R3(0,1) = -sin(rpy[2]);
  R3(0,2) = 0.0;
  R3(1,0) =-R3(0,1);
  R3(1,1) = R3(0,0);
  R3(1,2) = 0.0;
  R3(2,0) = 0.0;
  R3(2,1) = 0.0;
  R3(2,2) = 1.0;

  Matrix3d rotation = R3 * R2 * R1;

  rotation.col(0) = rotation.col(0) / rotation.col(0).norm();
  rotation.col(2) = rotation.col(0).cross(rotation.col(1));
  rotation.col(2) = rotation.col(2) / rotation.col(2).norm();
  rotation.col(1) = rotation.col(2).cross(rotation.col(0));
  rotation.col(1) = rotation.col(1) / rotation.col(1).norm();

  return rotation;
}